

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::DefaultsTest::Check
          (DefaultsTest *this,GLenum pname,GLint expected)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint result;
  int local_1bc;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1bc = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xba8))(this->m_vao,pname,&local_1bc);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetVertexArrayiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xfc1);
  iVar1 = local_1bc;
  if (local_1bc != expected) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Default Vertex Array Object has parameter ");
    local_1b8.m_getName = glu::getVertexAttribParameterNameName;
    local_1b8.m_value = pname;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
    std::operator<<((ostream *)this_00," equal to ");
    std::ostream::operator<<(this_00,local_1bc);
    std::operator<<((ostream *)this_00,", but ");
    std::ostream::operator<<(this_00,expected);
    std::operator<<((ostream *)this_00," was expected. Test fails.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return iVar1 == expected;
}

Assistant:

bool DefaultsTest::Check(const glw::GLenum pname, const glw::GLint expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint result = 0;

	gl.getVertexArrayiv(m_vao, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetVertexArrayiv call failed.");

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Default Vertex Array Object has parameter "
											<< glu::getVertexAttribParameterNameStr(pname) << " equal to " << result
											<< ", but " << expected << " was expected. Test fails."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}